

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tags.c
# Opt level: O2

void prvTidyFreeDeclaredTags(TidyDocImpl *doc,UserTagType tagType)

{
  DictHash **ppDVar1;
  ctmbstr s;
  DictHash *pDVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Dict **ppDVar6;
  _DictHash **pp_Var7;
  code *pcVar8;
  Dict *pDVar9;
  DictHash *pDVar10;
  Dict *d;
  bool bVar11;
  
  pDVar9 = (doc->tags).declared_tag_list;
  d = (Dict *)0x0;
LAB_00141f84:
  ppDVar6 = &d->next;
  bVar11 = d == (Dict *)0x0;
  d = pDVar9;
  if (bVar11) {
    ppDVar6 = &(doc->tags).declared_tag_list;
  }
  do {
    if (d == (Dict *)0x0) {
      return;
    }
    pDVar9 = d->next;
    switch(tagType) {
    case tagtype_empty:
      uVar3 = d->model;
      break;
    case tagtype_inline:
      uVar3 = d->model >> 4;
      break;
    default:
      goto switchD_00141fb7_caseD_3;
    case tagtype_block:
      if ((d->model & 8) != 0) {
        pcVar8 = prvTidyParseBlock;
        goto LAB_00141fed;
      }
      goto LAB_00141f84;
    case tagtype_pre:
      if ((d->model & 8) != 0) {
        pcVar8 = prvTidyParsePre;
LAB_00141fed:
        uVar3 = (uint)(d->parser == pcVar8);
        goto LAB_00141ff4;
      }
      goto LAB_00141f84;
    }
    uVar3 = uVar3 & 1;
LAB_00141ff4:
    if (uVar3 == 0) goto LAB_00141f84;
switchD_00141fb7_caseD_3:
    s = d->name;
    uVar4 = tagsHash(s);
    ppDVar1 = (doc->tags).hashtab + uVar4;
    pp_Var7 = ppDVar1;
    pDVar2 = (DictHash *)0x0;
    do {
      pDVar10 = pDVar2;
      pDVar2 = *pp_Var7;
      if ((pDVar2 == (DictHash *)0x0) || (pDVar2->tag == (Dict *)0x0)) goto LAB_00142065;
      iVar5 = prvTidytmbstrcmp(s,pDVar2->tag->name);
      pp_Var7 = &pDVar2->next;
    } while (iVar5 != 0);
    pp_Var7 = &pDVar10->next;
    if (pDVar10 == (DictHash *)0x0) {
      pp_Var7 = ppDVar1;
    }
    *pp_Var7 = pDVar2->next;
    (*doc->allocator->vtbl->free)(doc->allocator,pDVar2);
LAB_00142065:
    FreeDict(doc,d);
    *ppDVar6 = pDVar9;
    d = pDVar9;
  } while( true );
}

Assistant:

void TY_(FreeDeclaredTags)( TidyDocImpl* doc, UserTagType tagType )
{
    TidyTagImpl* tags = &doc->tags;
    Dict *curr, *next = NULL, *prev = NULL;

    for ( curr=tags->declared_tag_list; curr; curr = next )
    {
        Bool deleteIt = yes;
        next = curr->next;
        switch ( tagType )
        {
        case tagtype_empty:
            deleteIt = ( curr->model & CM_EMPTY ) != 0;
            break;

        case tagtype_inline:
            deleteIt = ( curr->model & CM_INLINE ) != 0;
            break;

        case tagtype_block:
            deleteIt = ( (curr->model & CM_BLOCK) != 0 &&
                         curr->parser == TY_(ParseBlock) );
            break;

        case tagtype_pre:
            deleteIt = ( (curr->model & CM_BLOCK) != 0 &&
                         curr->parser == TY_(ParsePre) );
            break;

        case tagtype_null:
            break;
        }

        if ( deleteIt )
        {
          tagsRemoveFromHash( doc, &doc->tags, curr->name );
          FreeDict( doc, curr );
          if ( prev )
            prev->next = next;
          else
            tags->declared_tag_list = next;
        }
        else
          prev = curr;
    }
}